

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O1

int Dtt_ComposeNP(int NP1,int NP2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = 0;
  uVar1 = 0;
  do {
    uVar3 = NP1 >> ((char)NP2 * '\x04' & 0x1fU);
    uVar1 = uVar1 | ((uVar3 ^ NP2) & 8 | uVar3 & 7) << ((byte)iVar2 & 0x1f);
    NP2 = NP2 >> 4;
    iVar2 = iVar2 + 4;
  } while (iVar2 != 0x14);
  return uVar1;
}

Assistant:

int Dtt_ComposeNP( int NP1, int NP2 )
{
    // NP[i] = NP1[NP2[i]]
    int NP = 0, i;
    for ( i = 0; i < 5; i++ )
    {
        NP |= ( ( NP1 >> ((NP2&0x7)<<2) ) & 0x7 ) << (i<<2); // P'[i] = P1[P2[i]]
        NP |= ( ( NP1 >> ((NP2&0x7)<<2) ^ NP2 ) & 0x8 ) << (i<<2); // N'[i] = N1[P2[i]] ^ N2[i]
        NP2 = NP2 >> 4;
    }
    return NP; 
}